

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O1

int WebPIoInitFromOptions(WebPDecoderOptions *options,VP8Io *io,WEBP_CSP_MODE src_colorspace)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int src_height;
  int iVar5;
  bool bVar6;
  int scaled_height;
  int scaled_width;
  int local_28;
  int local_24;
  
  iVar5 = io->width;
  iVar1 = io->height;
  if (options == (WebPDecoderOptions *)0x0) {
    io->use_cropping = 0;
  }
  else {
    bVar6 = options->use_cropping != 0;
    io->use_cropping = (uint)bVar6;
    if (bVar6) {
      iVar2 = options->crop_width;
      uVar3 = options->crop_top & 0xfffffffe;
      uVar4 = options->crop_left & 0xfffffffe;
      if (src_colorspace < MODE_YUV) {
        uVar3 = options->crop_top;
        uVar4 = options->crop_left;
      }
      if (iVar2 < 1) {
        return 0;
      }
      src_height = options->crop_height;
      if (src_height < 1) {
        return 0;
      }
      if ((int)(uVar3 | uVar4) < 0) {
        return 0;
      }
      if (((int)(iVar1 - uVar3) < src_height || (iVar1 < src_height || iVar1 <= (int)uVar3)) ||
          ((int)(iVar5 - uVar4) < iVar2 || (iVar5 < iVar2 || iVar5 <= (int)uVar4))) {
        return 0;
      }
      goto LAB_00110b15;
    }
  }
  uVar4 = 0;
  uVar3 = 0;
  iVar2 = iVar5;
  src_height = iVar1;
LAB_00110b15:
  io->crop_left = uVar4;
  io->crop_top = uVar3;
  io->crop_right = iVar2 + uVar4;
  io->crop_bottom = src_height + uVar3;
  io->mb_w = iVar2;
  io->mb_h = src_height;
  if (options == (WebPDecoderOptions *)0x0) {
    bVar6 = false;
  }
  else {
    bVar6 = options->use_scaling != 0;
  }
  io->use_scaling = (uint)bVar6;
  if (bVar6 != false) {
    local_24 = options->scaled_width;
    local_28 = options->scaled_height;
    iVar2 = WebPRescalerGetScaledDimensions(iVar2,src_height,&local_24,&local_28);
    if (iVar2 == 0) {
      return 0;
    }
    io->scaled_width = local_24;
    io->scaled_height = local_28;
  }
  uVar3 = 0;
  if (options != (WebPDecoderOptions *)0x0) {
    uVar3 = (uint)(options->bypass_filtering != 0);
  }
  io->bypass_filtering = uVar3;
  uVar4 = 1;
  if (options != (WebPDecoderOptions *)0x0) {
    uVar4 = (uint)(options->no_fancy_upsampling == 0);
  }
  io->fancy_upsampling = uVar4;
  if (io->use_scaling != 0) {
    iVar2 = iVar5 * 3 + 3;
    if (-1 < iVar5 * 3) {
      iVar2 = iVar5 * 3;
    }
    uVar4 = 0;
    if (io->scaled_width < iVar2 >> 2) {
      iVar5 = iVar1 * 3 + 3;
      if (-1 < iVar1 * 3) {
        iVar5 = iVar1 * 3;
      }
      uVar4 = (uint)(io->scaled_height < iVar5 >> 2);
    }
    io->bypass_filtering = uVar4 | uVar3;
    io->fancy_upsampling = 0;
  }
  return 1;
}

Assistant:

int WebPIoInitFromOptions(const WebPDecoderOptions* const options,
                          VP8Io* const io, WEBP_CSP_MODE src_colorspace) {
  const int W = io->width;
  const int H = io->height;
  int x = 0, y = 0, w = W, h = H;

  // Cropping
  io->use_cropping = (options != NULL) && options->use_cropping;
  if (io->use_cropping) {
    w = options->crop_width;
    h = options->crop_height;
    x = options->crop_left;
    y = options->crop_top;
    if (!WebPIsRGBMode(src_colorspace)) {   // only snap for YUV420
      x &= ~1;
      y &= ~1;
    }
    if (!WebPCheckCropDimensions(W, H, x, y, w, h)) {
      return 0;  // out of frame boundary error
    }
  }
  io->crop_left   = x;
  io->crop_top    = y;
  io->crop_right  = x + w;
  io->crop_bottom = y + h;
  io->mb_w = w;
  io->mb_h = h;

  // Scaling
  io->use_scaling = (options != NULL) && options->use_scaling;
  if (io->use_scaling) {
    int scaled_width = options->scaled_width;
    int scaled_height = options->scaled_height;
    if (!WebPRescalerGetScaledDimensions(w, h, &scaled_width, &scaled_height)) {
      return 0;
    }
    io->scaled_width = scaled_width;
    io->scaled_height = scaled_height;
  }

  // Filter
  io->bypass_filtering = (options != NULL) && options->bypass_filtering;

  // Fancy upsampler
#ifdef FANCY_UPSAMPLING
  io->fancy_upsampling = (options == NULL) || (!options->no_fancy_upsampling);
#endif

  if (io->use_scaling) {
    // disable filter (only for large downscaling ratio).
    io->bypass_filtering |= (io->scaled_width < W * 3 / 4) &&
                            (io->scaled_height < H * 3 / 4);
    io->fancy_upsampling = 0;
  }
  return 1;
}